

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

string * __thiscall
Assembler::instructionToAssembly_abi_cxx11_
          (string *__return_storage_ptr__,Assembler *this,Instruction *ins)

{
  int32_t iVar1;
  iterator iVar2;
  pair<int,_int> pVar3;
  Error *this_00;
  string *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_c0._M_dataplus._M_p._0_4_ = Instruction::getOpr(ins);
  iVar2 = std::
          _Rb_tree<Operation,_std::pair<const_Operation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_Operation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<Operation>,_std::allocator<std::pair<const_Operation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&ITATable_abi_cxx11_._M_t,(key_type *)&local_c0);
  if ((_Rb_tree_header *)iVar2._M_node == &ITATable_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    this_00 = (Error *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Unvalid operation type",(allocator<char> *)&local_c0);
    Error::Error(this_00,&local_40);
    __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
  }
  std::operator+(&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &iVar2._M_node[1]._M_parent,'\t');
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_c0);
  iVar1 = Instruction::getParamNum(ins);
  if (iVar1 == 1) {
    pVar3 = Instruction::getParam(ins);
    std::__cxx11::to_string(&local_c0,pVar3.first);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    this_01 = &local_c0;
  }
  else {
    if (iVar1 != 2) {
      return __return_storage_ptr__;
    }
    pVar3 = Instruction::getParam(ins);
    std::__cxx11::to_string(&local_80,pVar3.first);
    std::operator+(&local_60,&local_80,", ");
    pVar3 = Instruction::getParam(ins);
    std::__cxx11::to_string(&local_a0,pVar3.second);
    std::operator+(&local_c0,&local_60,&local_a0);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_60);
    this_01 = &local_80;
  }
  std::__cxx11::string::~string((string *)this_01);
  return __return_storage_ptr__;
}

Assistant:

std::string Assembler::instructionToAssembly(Instruction & ins) {
	std::string ret;
	if (auto it = ITATable.find(ins.getOpr()); it != ITATable.end()) {
		ret += it->second + '\t';
	}
	else {
		throw Error("Unvalid operation type");
	}
	switch (ins.getParamNum())
	{
	case 0:
		break;
	case 1:
		ret += std::to_string(ins.getParam().first);
		break;
	case 2:
		ret += std::to_string(ins.getParam().first) + ", " + std::to_string(ins.getParam().second);
		break;
	default:
		break;
	}
	return ret;
}